

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test<std::__cxx11::list<int,std::allocator<int>>>
               (list<int,_std::allocator<int>_> *value,serialization_category category,
               size_t serial_size)

{
  byte *pbVar1;
  bool bVar2;
  byte **ppbVar3;
  pointer pvVar4;
  size_t sVar5;
  basic_binary_ostream<fail_flag_serialization_policy> local_98;
  undefined1 local_70 [8];
  binary_istream istream;
  list<int,_std::allocator<int>_> value_copy;
  size_t size;
  binary_ostream ostream;
  size_t serial_size_local;
  serialization_category category_local;
  list<int,_std::allocator<int>_> *value_local;
  
  ostream._16_8_ = serial_size;
  if (category != container) {
    __assert_fail("serialization_category_v<T> == category",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0xc,"void test(const T &, serialization_category, size_t) [T = std::list<int>]");
  }
  basic_binary_ostream<fail_flag_serialization_policy>::span<std::array<std::byte,1000ul>&,void>
            ((basic_binary_ostream<fail_flag_serialization_policy> *)&size,&buffer);
  detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)&ostream.super_span<std::byte>.end_,value);
  if (((ostream.super_span<std::byte>.end_._0_1_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x10,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  ppbVar3 = span<std::byte>::data((span<std::byte> *)&size);
  pbVar1 = *ppbVar3;
  pvVar4 = std::array<std::byte,_1000UL>::data(&buffer);
  sVar5 = get_serialized_size<std::__cxx11::list<int,std::allocator<int>>>(value);
  if ((long)pbVar1 - (long)pvVar4 != sVar5) {
    __assert_fail("size == get_serialized_size(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x13,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  if ((long)pbVar1 - (long)pvVar4 == ostream._16_8_) {
    istream.
    super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
    .
    super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
    .super_fail_flag_serialization_policy.overflow =
         (stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
          )0x0;
    istream._17_7_ = 0;
    std::__cxx11::list<int,_std::allocator<int>_>::list
              ((list<int,_std::allocator<int>_> *)
               &istream.
                super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
              );
    basic_binary_istream<fail_flag_serialization_policy>::span<std::array<std::byte,1000ul>&,void>
              ((basic_binary_istream<fail_flag_serialization_policy> *)local_70,&buffer);
    detail::operator>>((istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                        *)&istream.super_span<const_std::byte>.end_,
                       (list<int,_std::allocator<int>_> *)
                       &istream.
                        super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      );
    ppbVar3 = span<std::byte>::data((span<std::byte> *)&size);
    pbVar1 = *ppbVar3;
    ppbVar3 = span<const_std::byte>::data((span<const_std::byte> *)local_70);
    if (pbVar1 != *ppbVar3) {
      __assert_fail("ostream.data() == istream.data()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                    ,0x1a,
                    "void test(const T &, serialization_category, size_t) [T = std::list<int>]");
    }
    bVar2 = std::operator==(value,(list<int,_std::allocator<int>_> *)
                                  &istream.
                                   super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                           );
    if (!bVar2) {
      __assert_fail("value == value_copy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                    ,0x1b,
                    "void test(const T &, serialization_category, size_t) [T = std::list<int>]");
    }
    pvVar4 = std::array<std::byte,_1000UL>::data(&buffer);
    basic_binary_ostream<fail_flag_serialization_policy>::span(&local_98,pvVar4,ostream._16_8_ - 1);
    ostream.super_span<std::byte>.end_._0_1_ =
         (bool)local_98.
               super_ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
               .
               super_stream_mixin_base<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
               .super_fail_flag_serialization_policy.overflow;
    size = (size_t)local_98.super_span<std::byte>.begin_;
    ostream.super_span<std::byte>.begin_ = local_98.super_span<std::byte>.end_;
    detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                        *)&ostream.super_span<std::byte>.end_,value);
    if ((ostream.super_span<std::byte>.end_._0_1_ & 1U) != 0) {
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)
                 &istream.
                  super_istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                );
      return;
    }
    __assert_fail("ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x1f,"void test(const T &, serialization_category, size_t) [T = std::list<int>]")
    ;
  }
  __assert_fail("size == serial_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                ,0x14,"void test(const T &, serialization_category, size_t) [T = std::list<int>]");
}

Assistant:

void test(T const& value, serialization_category category, size_t serial_size) {
    assert(serialization_category_v<T> == category);

    auto ostream = binary_ostream{ buffer };
    ostream << value;
    assert(!ostream.overflow);

    size_t const size = ostream.data() - buffer.data();
    assert(size == get_serialized_size(value));
    assert(size == serial_size);

    auto value_copy = T{};
    auto istream = binary_istream{ buffer };
    istream >> value_copy;

    assert(ostream.data() == istream.data());
    assert(value == value_copy);

    ostream = { buffer.data(), serial_size - 1 };
    ostream << value;
    assert(ostream.overflow);
}